

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::EnumDescriptorProto::InternalSerializeWithCachedSizesToArray
          (EnumDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  uint8 *puVar7;
  EpsCopyOutputStream *this_00;
  size_t __n;
  void *__src;
  long *in_RDX;
  _Alloc_hider *in_RSI;
  EnumDescriptorProto *in_RDI;
  string *s;
  int n_2;
  int i_2;
  uint n_1;
  uint i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  ptrdiff_t size;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  EnumDescriptorProto *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  EpsCopyOutputStream *in_stack_fffffffffffffe40;
  uint8 *in_stack_fffffffffffffe48;
  EnumOptions *in_stack_fffffffffffffe50;
  long *plVar8;
  undefined4 in_stack_fffffffffffffe58;
  uint32 in_stack_fffffffffffffe5c;
  EpsCopyOutputStream *in_stack_fffffffffffffe60;
  EpsCopyOutputStream *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int iVar9;
  uint local_170;
  uint local_168;
  _Alloc_hider *local_158;
  _Alloc_hider *local_f0;
  
  uVar5 = (in_RDI->_has_bits_).has_bits_[0];
  local_158 = in_RSI;
  if ((uVar5 & 1) != 0) {
    _internal_name_abi_cxx11_((EnumDescriptorProto *)0x685e75);
    in_stack_fffffffffffffe60 = (EpsCopyOutputStream *)std::__cxx11::string::data();
    _internal_name_abi_cxx11_((EnumDescriptorProto *)0x685e8c);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffe60,iVar2,SERIALIZE,
               "google.protobuf.EnumDescriptorProto.name");
    _internal_name_abi_cxx11_((EnumDescriptorProto *)0x685ec0);
    local_158 = (_Alloc_hider *)
                io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                           (string *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  local_168 = 0;
  uVar3 = _internal_value_size((EnumDescriptorProto *)0x685ef4);
  for (; local_168 < uVar3; local_168 = local_168 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffe30,
               (uint8 **)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    _internal_value(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    uVar4 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,(uint8 *)local_158);
    uVar4 = EnumValueDescriptorProto::GetCachedSize((EnumValueDescriptorProto *)0x685fd7);
    io::CodedOutputStream::WriteVarint32ToArray(uVar4,puVar7);
    local_158 = (_Alloc_hider *)
                EnumValueDescriptorProto::InternalSerializeWithCachedSizesToArray
                          ((EnumValueDescriptorProto *)in_stack_fffffffffffffe60,
                           (uint8 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                           (EpsCopyOutputStream *)in_stack_fffffffffffffe50);
  }
  if ((uVar5 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffe30,
               (uint8 **)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    _Internal::options(in_RDI);
    uVar4 = internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,(uint8 *)local_158);
    uVar4 = EnumOptions::GetCachedSize((EnumOptions *)0x686100);
    io::CodedOutputStream::WriteVarint32ToArray(uVar4,puVar7);
    local_158 = (_Alloc_hider *)
                EnumOptions::InternalSerializeWithCachedSizesToArray
                          (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                           in_stack_fffffffffffffe40);
  }
  local_170 = 0;
  uVar5 = _internal_reserved_range_size((EnumDescriptorProto *)0x68614e);
  for (; local_170 < uVar5; local_170 = local_170 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffe30,
               (uint8 **)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    _internal_reserved_range(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    uVar4 = internal::WireFormatLite::MakeTag(4,WIRETYPE_LENGTH_DELIMITED);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,(uint8 *)local_158);
    uVar4 = EnumDescriptorProto_EnumReservedRange::GetCachedSize
                      ((EnumDescriptorProto_EnumReservedRange *)0x686231);
    io::CodedOutputStream::WriteVarint32ToArray(uVar4,puVar7);
    local_158 = (_Alloc_hider *)
                EnumDescriptorProto_EnumReservedRange::InternalSerializeWithCachedSizesToArray
                          ((EnumDescriptorProto_EnumReservedRange *)in_stack_fffffffffffffe50,
                           in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  }
  iVar9 = 0;
  iVar2 = _internal_reserved_name_size((EnumDescriptorProto *)0x68628f);
  for (; iVar9 < iVar2; iVar9 = iVar9 + 1) {
    in_stack_fffffffffffffe78 =
         (EpsCopyOutputStream *)
         _internal_reserved_name_abi_cxx11_(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    this_00 = (EpsCopyOutputStream *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)this_00,iVar6,SERIALIZE,"google.protobuf.EnumDescriptorProto.reserved_name");
    plVar8 = in_RDX;
    __n = std::__cxx11::string::size();
    bVar1 = true;
    if ((long)__n < 0x80) {
      in_stack_fffffffffffffe40 = (EpsCopyOutputStream *)((*plVar8 - (long)local_158) + 0x10);
      iVar6 = io::EpsCopyOutputStream::TagSize(0x28);
      bVar1 = (long)in_stack_fffffffffffffe40 + (-1 - (long)iVar6) < (long)__n;
    }
    if (bVar1) {
      local_f0 = (_Alloc_hider *)
                 io::EpsCopyOutputStream::WriteStringOutline
                           (this_00,(uint32)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                            in_stack_fffffffffffffe38,(uint8 *)in_stack_fffffffffffffe30);
    }
    else {
      *local_158 = (_Alloc_hider)0x2a;
      local_158[1] = SUB81(__n,0);
      in_stack_fffffffffffffe38 = (string *)(local_158 + 2);
      __src = (void *)std::__cxx11::string::data();
      memcpy(in_stack_fffffffffffffe38,__src,__n);
      local_f0 = &((string *)(local_158 + 2))->_M_dataplus + __n;
    }
    local_158 = local_f0;
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    if (((uint)(in_RDI->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->_internal_metadata_);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_158 = (_Alloc_hider *)
                internal::WireFormat::InternalSerializeUnknownFieldsToArray
                          ((UnknownFieldSet *)CONCAT44(uVar5,iVar9),
                           (uint8 *)CONCAT44(iVar2,in_stack_fffffffffffffe80),
                           in_stack_fffffffffffffe78);
  }
  return (uint8 *)local_158;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* EnumDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.EnumDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_value_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(2, this->_internal_value(i), target, stream);
  }

  // optional .google.protobuf.EnumOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        3, _Internal::options(this), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_reserved_range_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(4, this->_internal_reserved_range(i), target, stream);
  }

  // repeated string reserved_name = 5;
  for (int i = 0, n = this->_internal_reserved_name_size(); i < n; i++) {
    const auto& s = this->_internal_reserved_name(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.EnumDescriptorProto.reserved_name");
    target = stream->WriteString(5, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumDescriptorProto)
  return target;
}